

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O1

bool __thiscall
EthBasePort::WriteBlockNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *wdata,uint nbytes,uchar flags)

{
  uchar *puVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  undefined6 in_register_00000032;
  uchar *puVar10;
  long *local_50 [2];
  long local_40 [2];
  
  if ((int)CONCAT62(in_register_00000032,node) == 0x3f) {
    bVar8 = 0;
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"WriteBlock","");
    iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,(string *)local_50,0);
    bVar8 = (byte)iVar4 ^ 1;
  }
  if ((node != 0x3f) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (bVar8 == 0) {
    BasePort::SetGenericBuffer(&this->super_BasePort);
    puVar10 = (this->super_BasePort).GenericBuffer;
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
    iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,2);
    iVar5 = (*(this->super_BasePort)._vptr_BasePort[0x15])(this);
    uVar9 = (ulong)(iVar5 + iVar4 + nbytes);
    uVar6 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
    uVar7 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,2);
    puVar1 = (this->super_BasePort).WriteBufferBroadcast;
    if ((uchar *)((long)wdata + (-(ulong)uVar7 - (ulong)uVar6)) == puVar1) {
      uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
      puVar10 = puVar1 + uVar3;
    }
    else {
      puVar10 = puVar10 + uVar3;
    }
    this->fw_tl = this->fw_tl + 1 & 0x3f;
    (*(this->super_BasePort)._vptr_BasePort[0x31])(this,puVar10,uVar9,node,(ulong)flags);
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,0);
    puVar10[uVar3] = '\0';
    if (((flags & 0x40) != 0) || (this->useFwBridge == false)) {
      puVar10[uVar3] = '\x01';
    }
    puVar10[uVar3 + 1] = (uchar)(this->super_BasePort).FwBusGeneration;
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    make_bwrite_packet(this,(quadlet_t *)(puVar10 + uVar3),node,addr,wdata,nbytes,(uint)this->fw_tl)
    ;
    iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                      (this,node,puVar10,uVar9,(ulong)(flags >> 7));
    uVar2 = (undefined1)iVar4;
  }
  else {
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

bool EthBasePort::WriteBlockNode(nodeid_t node, nodeaddr_t addr, quadlet_t *wdata,
                                 unsigned int nbytes, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("WriteBlock"))
        return false;

    // Packet to send
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *packet = GenericBuffer+GetWriteQuadAlign();
    size_t packetSize = GetPrefixOffset(WR_FW_BDATA) + nbytes + GetWritePostfixSize();

    // Check for real-time write
    unsigned char *wdata_base = reinterpret_cast<unsigned char *>(wdata)-GetWriteQuadAlign()-GetPrefixOffset(WR_FW_BDATA);
    if (wdata_base == WriteBufferBroadcast) {
        packet = WriteBufferBroadcast+GetWriteQuadAlign();
    }

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(packet, packetSize, node, flags);

    // Make control word
    make_write_header(packet, packetSize, flags);

    // Build FireWire packet
    make_bwrite_packet(reinterpret_cast<quadlet_t *>(packet+GetPrefixOffset(WR_FW_HEADER)), node, addr, wdata, nbytes, fw_tl);

    // Now, send the packet
    return PacketSend(node, packet, packetSize, flags&FW_NODE_ETH_BROADCAST_MASK);
}